

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O0

void * argtable3_xcalloc(size_t count,size_t size)

{
  void *pvVar1;
  size_t local_40;
  size_t local_38;
  void *ret;
  size_t allocated_size;
  size_t allocated_count;
  size_t size_local;
  size_t count_local;
  
  if ((count == 0) || (local_38 = count, size == 0)) {
    local_38 = 1;
  }
  if ((count == 0) || (local_40 = size, size == 0)) {
    local_40 = 1;
  }
  pvVar1 = calloc(local_38,local_40);
  if (pvVar1 == (void *)0x0) {
    (*s_panic)("Out of memory!\n");
  }
  return pvVar1;
}

Assistant:

void* xcalloc(size_t count, size_t size) {
    size_t allocated_count = count && size ? count : 1;
    size_t allocated_size = count && size ? size : 1;
    void* ret = calloc(allocated_count, allocated_size);
    if (!ret) {
        s_panic("Out of memory!\n");
    }
    return ret;
}